

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O3

Iterator *
testing::internal::
CheckedDowncastToActualType<testing::internal::ValuesInIteratorRangeGenerator<Base64TestVector>::Iterator_const,testing::internal::ParamIteratorInterface<Base64TestVector>const>
          (ParamIteratorInterface<Base64TestVector> *base)

{
  long lVar1;
  bool bVar2;
  GTestLog local_c;
  
  if (base == (ParamIteratorInterface<Base64TestVector> *)0x0) {
    bVar2 = true;
  }
  else {
    lVar1 = __dynamic_cast(base,&ParamIteratorInterface<Base64TestVector>::typeinfo,
                           &ValuesInIteratorRangeGenerator<Base64TestVector>::Iterator::typeinfo,0);
    bVar2 = lVar1 != 0;
  }
  bVar2 = IsTrue(bVar2);
  if (!bVar2) {
    GTestLog::GTestLog(&local_c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x486);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Condition base == nullptr || dynamic_cast<Derived*>(base) != nullptr failed. ",0x4d)
    ;
    GTestLog::~GTestLog(&local_c);
  }
  return (Iterator *)base;
}

Assistant:

Derived* CheckedDowncastToActualType(Base* base) {
  static_assert(std::is_base_of<Base, Derived>::value,
                "target type not derived from source type");
#if GTEST_HAS_RTTI
  GTEST_CHECK_(base == nullptr || dynamic_cast<Derived*>(base) != nullptr);
#endif
  return static_cast<Derived*>(base);
}